

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

object_storage * __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::object_storage
::get_allocator(object_storage *this)

{
  assertion_error *this_00;
  long in_RSI;
  string local_38;
  
  if (*(long *)(in_RSI + 8) != 0) {
    return this;
  }
  this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"assertion \'ptr_ != nullptr\' failed at  <> :0","");
  assertion_error::assertion_error(this_00,&local_38);
  __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Allocator get_allocator() const
            {
                JSONCONS_ASSERT(ptr_ != nullptr);
                return ptr_->get_allocator();
            }